

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

bool __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
          (Object<(anonymous_namespace)::InheritedStruct> *this,InheritedStruct *out,Value *value,
          cmJSONState *state)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  pointer pMVar4;
  string name;
  cmJSONState *local_c0;
  _Any_data local_b8;
  ValueHolder local_a8;
  code *local_a0;
  _Any_data local_98;
  pointer local_88;
  code *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  Object<(anonymous_namespace)::InheritedStruct> *local_58;
  InheritedStruct *local_50;
  _Any_data *local_48;
  pointer local_40;
  cmJSONState *local_38;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = out;
  if (value == (Value *)0x0) {
    if (this->AnyRequired != true) goto LAB_001b762d;
    local_98._M_unused._M_member_pointer = local_98._M_unused._M_member_pointer & 0xffffffff00000000
    ;
    if ((this->Error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->Error)._M_invoker)
              ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_b8,
               (_Any_data *)&this->Error,(ObjectError *)local_98._M_pod_data,&local_78);
    local_98._M_unused._M_object = (ValueHolder *)0x0;
    if (local_a8 == (pointer)0x0) {
      local_c0 = state;
      std::__throw_bad_function_call();
    }
    local_c0 = state;
    (*local_a0)(&local_b8,&local_98,&local_c0);
    if (local_a8 != (pointer)0x0) {
      (*(code *)local_a8)(&local_b8,&local_b8,3);
    }
  }
  else {
    bVar2 = Json::Value::isObject(value);
    if (bVar2) {
      Json::Value::getMemberNames_abi_cxx11_((Members *)&local_98,value);
      local_a8 = (ValueHolder)
                 local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8._8_8_ =
           local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_b8._M_unused._M_object =
           local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._M_unused._0_8_;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
      local_98._M_unused._M_object = (ValueHolder *)0x0;
      local_98._8_8_ = (ValueHolder *)0x0;
      local_88 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
LAB_001b762d:
      pMVar4 = (this->Members).
               super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (this->Members).
                 super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = this;
      if (pMVar4 == local_40) {
        bVar2 = true;
      }
      else {
        local_48 = (_Any_data *)&this->Error;
        bVar2 = true;
        do {
          pcVar1 = (pMVar4->Name)._M_str;
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar1,pcVar1 + (pMVar4->Name)._M_len);
          cmJSONState::push_stack(state,(string *)&local_b8,value);
          if ((value == (Value *)0x0) ||
             (bVar3 = Json::Value::isMember(value,(String *)&local_b8), !bVar3)) {
            if (pMVar4->Required == false) {
              local_98._M_unused._M_object = (ValueHolder *)0x0;
              if ((pMVar4->Function).super__Function_base._M_manager == (_Manager_type)0x0)
              goto LAB_001b791d;
              local_c0 = state;
              bVar3 = (*(pMVar4->Function)._M_invoker)
                                ((_Any_data *)&pMVar4->Function,local_50,(Value **)&local_98,
                                 &local_c0);
              bVar2 = (bool)(bVar3 & bVar2);
            }
            else {
              local_c0 = (cmJSONState *)CONCAT44(local_c0._4_4_,3);
              if ((local_58->Error).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              (*(local_58->Error)._M_invoker)
                        ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_98,local_48,
                         (ObjectError *)&local_c0,&local_78);
              local_c0 = (cmJSONState *)value;
              local_38 = state;
              if (local_88 == (pointer)0x0) {
                std::__throw_bad_function_call();
              }
              (*local_80)(&local_98,(Value **)&local_c0,&local_38);
              if (local_88 != (pointer)0x0) {
                (*(code *)local_88)(&local_98,&local_98,3);
              }
              bVar2 = false;
            }
          }
          else {
            local_98._M_unused._M_object = Json::Value::operator[](value,(String *)&local_b8);
            if ((pMVar4->Function).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001b791d:
              local_c0 = state;
              std::__throw_bad_function_call();
            }
            local_c0 = state;
            bVar3 = (*(pMVar4->Function)._M_invoker)
                              ((_Any_data *)&pMVar4->Function,local_50,(Value **)&local_98,&local_c0
                              );
            __position = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   (local_78.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    local_78.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase(&local_78,(iterator)__position._M_current);
            bVar2 = (bool)(bVar3 & bVar2);
          }
          cmJSONState::pop_stack(state);
          if ((ValueHolder *)local_b8._M_unused._0_8_ != &local_a8) {
            operator_delete(local_b8._M_unused._M_object,
                            (ulong)&((local_a8.map_)->_M_t)._M_impl.field_0x1);
          }
          pMVar4 = pMVar4 + 1;
        } while (pMVar4 != local_40);
      }
      if ((local_58->AllowExtra != false) ||
         (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_001b78fe;
      local_98._0_4_ = 2;
      if ((local_58->Error).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(local_58->Error)._M_invoker)
                ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_b8,
                 (_Any_data *)&local_58->Error,(ObjectError *)local_98._M_pod_data,&local_78);
      if (local_a8 == (pointer)0x0) {
        local_c0 = state;
        local_98._M_unused._M_object = value;
        std::__throw_bad_function_call();
      }
      local_c0 = state;
      local_98._M_unused._M_object = value;
      (*local_a0)(&local_b8,&local_98,&local_c0);
      if (local_a8 != (pointer)0x0) {
        (*(code *)local_a8)(&local_b8,&local_b8,3);
      }
    }
    else {
      local_98._0_4_ = 1;
      if ((this->Error).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->Error)._M_invoker)
                ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&local_b8,
                 (_Any_data *)&this->Error,(ObjectError *)local_98._M_pod_data,&local_78);
      if (local_a8 == (pointer)0x0) {
        local_c0 = state;
        local_98._M_unused._M_object = value;
        std::__throw_bad_function_call();
      }
      local_c0 = state;
      local_98._M_unused._M_object = value;
      (*local_a0)(&local_b8,&local_98,&local_c0);
      if (local_a8 != (pointer)0x0) {
        (*(code *)local_a8)(&local_b8,&local_b8,3);
      }
    }
  }
  bVar2 = false;
LAB_001b78fe:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return bVar2;
}

Assistant:

bool operator()(T& out, const Json::Value* value, cmJSONState* state) const
    {
      Json::Value::Members extraFields;
      bool success = true;
      if (!value && this->AnyRequired) {
        Error(JsonErrors::ObjectError::RequiredMissing, extraFields)(value,
                                                                     state);
        return false;
      }
      if (value && !value->isObject()) {
        Error(JsonErrors::ObjectError::InvalidObject, extraFields)(value,
                                                                   state);
        return false;
      }
      if (value) {
        extraFields = value->getMemberNames();
      }

      for (auto const& m : this->Members) {
        std::string name(m.Name.data(), m.Name.size());
        state->push_stack(name, value);
        if (value && value->isMember(name)) {
          if (!m.Function(out, &(*value)[name], state)) {
            success = false;
          }
          extraFields.erase(
            std::find(extraFields.begin(), extraFields.end(), name));
        } else if (!m.Required) {
          if (!m.Function(out, nullptr, state)) {
            success = false;
          }
        } else {
          Error(JsonErrors::ObjectError::MissingRequired, extraFields)(value,
                                                                       state);
          success = false;
        }
        state->pop_stack();
      }

      if (!this->AllowExtra && !extraFields.empty()) {
        Error(JsonErrors::ObjectError::ExtraField, extraFields)(value, state);
        success = false;
      }
      return success;
    }